

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
          (small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *this,size_ty request)

{
  ulong uVar1;
  size_ty sVar2;
  size_ty current_capacity;
  Term *__dest;
  
  uVar1 = (this->m_data).super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.
          m_capacity;
  if (uVar1 < request) {
    if (request >> 0x3b != 0) {
      throw_allocation_size_error();
    }
    if (request < uVar1 * 2) {
      request = uVar1 * 2;
    }
    if (0x7ffffffffffffff - uVar1 <= uVar1) {
      request = 0x7ffffffffffffff;
    }
    __dest = __gnu_cxx::new_allocator<mp::LinearExpr::Term>::allocate
                       ((new_allocator<mp::LinearExpr::Term> *)this,request,(void *)0x0);
    sVar2 = (this->m_data).super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.
            m_size;
    if (sVar2 != 0) {
      memcpy(__dest,(this->m_data).
                    super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr,
             sVar2 << 4);
    }
    uVar1 = (this->m_data).super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.
            m_capacity;
    if (6 < uVar1) {
      operator_delete((this->m_data).
                      super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr
                      ,uVar1 << 4);
    }
    (this->m_data).super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
         __dest;
    (this->m_data).super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity =
         request;
  }
  return;
}

Assistant:

constexpr ptr     data_ptr (void) const noexcept { return m_data_ptr; }